

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O3

void __thiscall
pfederc::Parser::parseClassBody
          (Parser *this,Token *tokId,bool *err,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *attributes,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  size_t *psVar1;
  int iVar2;
  Token *pTVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 uVar6;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *plVar7;
  bool bVar8;
  _List_node_base *p_Var9;
  pointer __p;
  initializer_list<pfederc::Position> __l;
  allocator_type local_a9;
  Position local_a8;
  undefined1 local_88 [32];
  Error<pfederc::SyntaxErrorCode> *local_68;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *local_60;
  _Base_ptr local_58;
  Token *local_50;
  undefined1 local_48 [16];
  
  local_60 = attributes;
  local_58 = (_Base_ptr)err;
  local_50 = tokId;
  bVar8 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
  if (bVar8) {
    do {
      bVar8 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if (!bVar8) break;
      bVar8 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar8) {
        Lexer::next(this->lexer);
      }
      else {
        parseExpression((Parser *)local_88,(Precedence)this);
        uVar6 = local_88._0_8_;
        if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
          iVar2 = *(int *)&(((string *)(local_88._0_8_ + 0x18))->_M_dataplus)._M_p;
          if (iVar2 == 0x12) {
            if (*(_List_node_base **)local_88._0_8_ != (_List_node_base *)&PTR__BiOpExpr_0012b990) {
              __cxa_bad_cast();
            }
            if ((short)((string *)(local_88._0_8_ + 0x38))->_M_string_length != 0x53)
            goto LAB_00112a54;
            local_88._0_8_ = (Lexer *)0x0;
            local_a8.line = uVar6;
            p_Var9 = (_List_node_base *)operator_new(0x18);
            plVar7 = local_60;
            p_Var9[1]._M_next = (_List_node_base *)local_a8.line;
            local_a8.line = 0;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(plVar7->
                      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_> *)
                       &local_a8);
          }
          else if (iVar2 == 4) {
            local_88._0_8_ = (Lexer *)0x0;
            local_a8.line = uVar6;
            if (*(_List_node_base **)uVar6 != (_List_node_base *)&PTR__FuncExpr_0012b788) {
              local_a8.line = (size_t)(Lexer *)0x0;
            }
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = (_List_node_base *)local_a8.line;
            local_a8.line = 0;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(functions->
                      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                       &local_a8);
          }
          else {
LAB_00112a54:
            local_a8.line = (size_t)operator_new(0x38);
            sVar4 = *(size_t *)((long)&((string *)(uVar6 + 0x18))->field_2 + 8);
            ((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->logLevel = LVL_ERROR;
            ((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->err = STX_ERR_CLASS_SCOPE;
            sVar5 = (((string *)(uVar6 + 0x18))->field_2)._M_allocated_capacity;
            (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->pos).line =
                 ((string *)(uVar6 + 0x18))->_M_string_length;
            (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->pos).startIndex = sVar5;
            (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->pos).endIndex = sVar4;
            (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            generateError((Parser *)&stack0xffffffffffffffc8,
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        &stack0xffffffffffffffc8);
            if ((Error<pfederc::SyntaxErrorCode> *)local_a8.line !=
                (Error<pfederc::SyntaxErrorCode> *)0x0) {
              std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                        ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_a8,
                         (Error<pfederc::SyntaxErrorCode> *)local_a8.line);
            }
          }
        }
        bVar8 = expect(this,TOK_EOL);
        if (!bVar8) {
          pTVar3 = this->lexer->currentToken;
          local_a8.line = (size_t)operator_new(0x38);
          sVar4 = (pTVar3->pos).endIndex;
          ((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->logLevel = LVL_ERROR;
          ((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->err = STX_ERR_EXPECTED_EOL;
          sVar5 = (pTVar3->pos).startIndex;
          (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->pos).line = (pTVar3->pos).line;
          (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->pos).startIndex = sVar5;
          (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->pos).endIndex = sVar4;
          (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (((Error<pfederc::SyntaxErrorCode> *)local_a8.line)->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          generateError((Parser *)(local_48 + 8),
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     (local_48 + 8));
          if ((Error<pfederc::SyntaxErrorCode> *)local_a8.line !=
              (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_a8,
                       (Error<pfederc::SyntaxErrorCode> *)local_a8.line);
          }
          skipToStmtEol(this);
        }
        if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
          (*(code *)(*(_List_node_base **)local_88._0_8_)->_M_prev)();
        }
      }
      bVar8 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    } while (bVar8);
  }
  bVar8 = expect(this,TOK_STMT);
  if (!bVar8) {
    pTVar3 = this->lexer->currentToken;
    local_a8.line = (local_50->pos).line;
    local_a8.startIndex = (local_50->pos).startIndex;
    local_a8.endIndex = (local_50->pos).endIndex;
    __l._M_len = 1;
    __l._M_array = &local_a8;
    std::vector<pfederc::Position,_std::allocator<pfederc::Position>_>::vector
              ((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)local_88,__l,
               &local_a9);
    local_68 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar4 = (pTVar3->pos).endIndex;
    local_68->logLevel = LVL_ERROR;
    local_68->err = STX_ERR_EXPECTED_STMT;
    sVar5 = (pTVar3->pos).startIndex;
    (local_68->pos).line = (pTVar3->pos).line;
    (local_68->pos).startIndex = sVar5;
    (local_68->pos).endIndex = sVar4;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    (local_68->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
    local_88._0_8_ = (Lexer *)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = (pointer)0x0;
    generateError((Parser *)local_48,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_48)
    ;
    if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,local_68);
    }
    local_68 = (Error<pfederc::SyntaxErrorCode> *)0x0;
    if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
    }
    *(bool *)&local_58->_M_color = true;
  }
  return;
}

Assistant:

void Parser::parseClassBody(const Token *const tokId, bool &err,
    std::list<std::unique_ptr<BiOpExpr>> &attributes,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {

  // classbody
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      functions.push_back(
        std::unique_ptr<FuncExpr>(
          dynamic_cast<FuncExpr*>(expr.release())));
    } else if (expr && isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
      attributes.push_back(
        std::unique_ptr<BiOpExpr>(
          dynamic_cast<BiOpExpr*>(expr.release())));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_CLASS_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
  // end of class body
  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition(),
      std::vector<Position> { tokId->getPosition() }));
    err = true;
  }
}